

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

TypeAliasType * __thiscall
slang::BumpAllocator::
emplace<slang::ast::TypeAliasType,char_const(&)[6],slang::SourceLocation_const&>
          (BumpAllocator *this,char (*args) [6],SourceLocation *args_1)

{
  TypeAliasType *pTVar1;
  BumpAllocator *in_RDX;
  TypeAliasType *in_RDI;
  SourceLocation unaff_retaddr;
  string_view in_stack_00000008;
  char *in_stack_ffffffffffffffd8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  
  pTVar1 = (TypeAliasType *)
           allocate(in_RDX,(size_t)in_stack_ffffffffffffffe0,(size_t)in_stack_ffffffffffffffd8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  slang::ast::TypeAliasType::TypeAliasType(in_RDI,in_stack_00000008,unaff_retaddr);
  return pTVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }